

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O1

bool spdlog::details::os::create_dir(filename_t *path)

{
  int iVar1;
  size_type sVar2;
  ulong uVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  stat buffer;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  stat local_c0;
  
  iVar1 = stat((path->_M_dataplus)._M_p,&local_c0);
  if (iVar1 == 0) {
    bVar4 = true;
  }
  else if (path->_M_string_length == 0) {
    bVar4 = false;
  }
  else {
    uVar3 = 0;
    do {
      sVar2 = std::__cxx11::string::find_first_of((char *)path,0x1983f4,uVar3);
      if (sVar2 == 0xffffffffffffffff) {
        sVar2 = path->_M_string_length;
      }
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)path);
      if (((local_d8 == 0) || (iVar1 = stat((char *)local_e0,&local_c0), iVar1 == 0)) ||
         (iVar1 = mkdir((char *)local_e0,0x1ed), iVar1 == 0)) {
        uVar3 = sVar2 + 1;
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
    } while ((bVar4 & uVar3 < path->_M_string_length) != 0);
  }
  return bVar4;
}

Assistant:

SPDLOG_INLINE bool create_dir(const filename_t &path)
{
    if (path_exists(path))
    {
        return true;
    }

    if (path.empty())
    {
        return false;
    }

    size_t search_offset = 0;
    do
    {
        auto token_pos = path.find_first_of(folder_seps_filename, search_offset);
        // treat the entire path as a folder if no folder separator not found
        if (token_pos == filename_t::npos)
        {
            token_pos = path.size();
        }

        auto subdir = path.substr(0, token_pos);

        if (!subdir.empty() && !path_exists(subdir) && !mkdir_(subdir))
        {
            return false; // return error if failed creating dir
        }
        search_offset = token_pos + 1;
    } while (search_offset < path.size());

    return true;
}